

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSGetNumConvFails(void *arkode_mem,long *nlcfails)

{
  int iVar1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSGetNumConvFails",&local_10,&local_18);
  if (iVar1 == 0) {
    *nlcfails = local_18->ncfl;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumConvFails(void *arkode_mem, long int *nlcfails)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; set output value and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSGetNumConvFails",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *nlcfails = arkls_mem->ncfl;
  return(ARKLS_SUCCESS);
}